

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

domain_manager * __thiscall
cs::domain_manager::add_var<char_const(&)[7]>(domain_manager *this,char (*name) [7],var *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  stack_pointer psVar2;
  domain_type *pdVar3;
  bool bVar4;
  size_t sVar5;
  runtime_error *prVar6;
  long *plVar7;
  error *peVar8;
  size_type *psVar9;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar2 = *this->fiber_stack;
  if (psVar2 == (stack_pointer)0x0) {
    pdVar3 = (this->m_data).m_current;
    if (pdVar3 == (this->m_data).m_start) {
      peVar8 = (error *)__cxa_allocate_exception(0x28);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
      local_90._M_string_length = 5;
      cov::error::error(peVar8,&local_90);
      __cxa_throw(peVar8,&cov::error::typeinfo,cov::error::~error);
    }
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(*name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,name,*name + sVar5);
    bVar4 = domain_type::add_var_optimal(pdVar3 + -1,&local_90,val,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar5 = strlen(*name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,name,*name + sVar5);
      std::operator+(&local_50,"Target domain exist variable \"",&local_70);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar9) {
        local_90.field_2._M_allocated_capacity = *psVar9;
        local_90.field_2._8_8_ = plVar7[3];
        local_90._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar9;
      }
      local_90._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      runtime_error::runtime_error(prVar6,&local_90);
      __cxa_throw(prVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    pdVar3 = psVar2->m_current;
    if (pdVar3 == psVar2->m_start) {
      peVar8 = (error *)__cxa_allocate_exception(0x28);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
      local_90._M_string_length = 5;
      cov::error::error(peVar8,&local_90);
      __cxa_throw(peVar8,&cov::error::typeinfo,cov::error::~error);
    }
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(*name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,name,*name + sVar5);
    bVar4 = domain_type::add_var_optimal(pdVar3 + -1,&local_90,val,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar5 = strlen(*name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,name,*name + sVar5);
      std::operator+(&local_50,"Target domain exist variable \"",&local_70);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar9) {
        local_90.field_2._M_allocated_capacity = *psVar9;
        local_90.field_2._8_8_ = plVar7[3];
        local_90._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar9;
      }
      local_90._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      runtime_error::runtime_error(prVar6,&local_90);
      __cxa_throw(prVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return this;
}

Assistant:

domain_manager &add_var(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			return *this;
		}